

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

size_t nifti_read_buffer(znzFile fp,void *dataptr,size_t ntot,nifti_image *nim)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  float *far;
  size_t sVar5;
  
  if (dataptr == (void *)0x0) {
    sVar5 = 0xffffffffffffffff;
    if (0 < g_opts_0) {
      nifti_read_buffer_cold_1();
    }
  }
  else {
    sVar2 = znzread(dataptr,1,ntot,fp);
    if (sVar2 < ntot) {
      sVar5 = 0xffffffffffffffff;
      if (0 < g_opts_0) {
        fprintf(_stderr,
                "++ WARNING: nifti_read_buffer(%s):\n   data bytes needed = %u\n   data bytes input  = %u\n   number missing    = %u (set to 0)\n"
                ,nim->iname,ntot & 0xffffffff,sVar2 & 0xffffffff,
                (ulong)(uint)((int)ntot - (int)sVar2));
      }
    }
    else {
      if (2 < g_opts_0) {
        fprintf(_stderr,"+d nifti_read_buffer: read %u bytes\n",sVar2 & 0xffffffff);
      }
      iVar1 = nim->swapsize;
      if ((1 < iVar1) && (nim->byteorder != 1)) {
        if (1 < g_opts_0) {
          fwrite("+d nifti_read_buffer: swapping data bytes...\n",0x2d,1,_stderr);
          iVar1 = nim->swapsize;
        }
        nifti_swap_Nbytes((long)(int)(ntot / (ulong)(long)iVar1),iVar1,dataptr);
      }
      iVar1 = nim->datatype;
      uVar4 = 0;
      if (iVar1 < 0x40) {
        if (((iVar1 == 0x10) || (iVar1 == 0x20)) && (3 < ntot)) {
          uVar4 = 0;
          uVar3 = 0;
          do {
            if (0x7f7fffff < (*(uint *)((long)dataptr + uVar3 * 4) & 0x7fffffff)) {
              *(undefined4 *)((long)dataptr + uVar3 * 4) = 0;
              uVar4 = (ulong)((int)uVar4 + 1);
            }
            uVar3 = uVar3 + 1;
          } while (ntot >> 2 != uVar3);
        }
      }
      else if (((iVar1 == 0x40) || (iVar1 == 0x700)) && (uVar4 = 0, 7 < ntot)) {
        uVar3 = 0;
        uVar4 = 0;
        do {
          if (0x7fefffffffffffff < (*(ulong *)((long)dataptr + uVar3 * 8) & 0x7fffffffffffffff)) {
            *(undefined8 *)((long)dataptr + uVar3 * 8) = 0;
            uVar4 = (ulong)((int)uVar4 + 1);
          }
          uVar3 = uVar3 + 1;
        } while (ntot >> 3 != uVar3);
      }
      sVar5 = sVar2;
      if (1 < g_opts_0) {
        fprintf(_stderr,"+d in image, %d bad floats were set to 0\n",uVar4);
      }
    }
  }
  return sVar5;
}

Assistant:

size_t nifti_read_buffer(znzFile fp, void* dataptr, size_t ntot,
                                nifti_image *nim)
{
  size_t ii;

  if( dataptr == NULL ){
     if( g_opts.debug > 0 )
        fprintf(stderr,"** ERROR: nifti_read_buffer: NULL dataptr\n");
     return -1;
  }

  ii = znzread( dataptr , 1 , ntot , fp ) ;             /* data input */

  /* if read was short, fail */
  if( ii < ntot ){
    if( g_opts.debug > 0 )
       fprintf(stderr,"++ WARNING: nifti_read_buffer(%s):\n"
               "   data bytes needed = %u\n"
               "   data bytes input  = %u\n"
               "   number missing    = %u (set to 0)\n",
               nim->iname , (unsigned int)ntot ,
               (unsigned int)ii , (unsigned int)(ntot-ii) ) ;
    /* memset( (char *)(dataptr)+ii , 0 , ntot-ii ) ;  now failure [rickr] */
    return -1 ;
  }

  if( g_opts.debug > 2 )
    fprintf(stderr,"+d nifti_read_buffer: read %u bytes\n", (unsigned)ii);

  /* byte swap array if needed */

  /* ntot/swapsize might not fit as int, use size_t    6 Jul 2010 [rickr] */
  if( nim->swapsize > 1 && nim->byteorder != nifti_short_order() ) {
    if( g_opts.debug > 1 )
       fprintf(stderr,"+d nifti_read_buffer: swapping data bytes...\n");
    nifti_swap_Nbytes( (int)(ntot / nim->swapsize), nim->swapsize , dataptr ) ;
  }

#ifdef isfinite
{
  /* check input float arrays for goodness, and fix bad floats */
  int fix_count = 0 ;

  switch( nim->datatype ){

    case NIFTI_TYPE_FLOAT32:
    case NIFTI_TYPE_COMPLEX64:{
        register float *far = (float *)dataptr ; register size_t jj,nj ;
        nj = ntot / sizeof(float) ;
        for( jj=0 ; jj < nj ; jj++ )   /* count fixes 30 Nov 2004 [rickr] */
           if( !IS_GOOD_FLOAT(far[jj]) ){
              far[jj] = 0 ;
              fix_count++ ;
           }
      }
      break ;

    case NIFTI_TYPE_FLOAT64:
    case NIFTI_TYPE_COMPLEX128:{
        register double *far = (double *)dataptr ; register size_t jj,nj ;
        nj = ntot / sizeof(double) ;
        for( jj=0 ; jj < nj ; jj++ )   /* count fixes 30 Nov 2004 [rickr] */
           if( !IS_GOOD_FLOAT(far[jj]) ){
              far[jj] = 0 ;
              fix_count++ ;
           }
      }
      break ;

  }

  if( g_opts.debug > 1 )
     fprintf(stderr,"+d in image, %d bad floats were set to 0\n", fix_count);
}
#endif

  return ii;
}